

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

plain_iterator * __thiscall
dg::vr::ValueRelations::begin(plain_iterator *__return_storage_ptr__,ValueRelations *this)

{
  PlainValueIterator::PlainValueIterator
            (__return_storage_ptr__,
             (this->bucketToVals)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (BucketIterator)&(this->bucketToVals)._M_t._M_impl.super__Rb_tree_header);
  return __return_storage_ptr__;
}

Assistant:

ValueRelations::plain_iterator ValueRelations::begin() const {
    return {bucketToVals.begin(), bucketToVals.end()};
}